

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record(ThreadContextTTD *this)

{
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar1;
  BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  Type pSVar2;
  RecyclableObject *pRVar3;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar4;
  RecyclableObject *pRVar5;
  Type pSVar6;
  DictionaryStats *pDVar7;
  uint uVar8;
  uint uVar9;
  hash_t bucket;
  uint i;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_02;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int nextIndex;
  uint previous;
  uint uVar16;
  byte bVar17;
  bool bVar18;
  
  CleanRecordWeakRootMap(this);
  this_00 = &this->m_ttdRootTagToObjectMap;
  if ((this->m_ttdRootTagToObjectMap).bucketCount != 0) {
    uVar11 = 0;
    do {
      uVar9 = this_00->buckets[uVar11];
      if (uVar9 != 0xffffffff) {
        uVar12 = 0xffffffff;
        do {
          pSVar2 = (this->m_ttdRootTagToObjectMap).entries;
          this_02 = Memory::
                    RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
                    ::operator->(&this->m_ttdRecordRootWeakMap);
          uVar16 = 0xffffffff;
          uVar14 = 0xffffffff;
          if ((this_02->buckets).ptr != (int *)0x0) {
            pRVar3 = pSVar2[(int)uVar9].
                     super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                     super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                     .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value;
            uVar14 = (uint)((ulong)pRVar3 >> 3) | 1;
            bucket = PrimePolicy::ModPrime(uVar14,this_02->size,this_02->modFunctionIndex);
            if ((this_02->buckets).ptr != (int *)0x0) {
              Memory::Recycler::IsSweeping(this_02->recycler);
              i = (this_02->buckets).ptr[bucket];
              if ((int)i < 0) {
                bVar18 = true;
                uVar14 = 0xffffffff;
              }
              else {
                previous = 0xffffffff;
                do {
                  pWVar4 = (this_02->entries).ptr;
                  if (pWVar4[i].hash == uVar14) {
                    pRVar5 = (RecyclableObject *)
                             ((pWVar4[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
                    if (pRVar5 == (RecyclableObject *)0x0) {
                      i = JsUtil::
                          WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
                          ::RemoveEntry(this_02,i,previous,bucket);
                      bVar17 = 3;
                    }
                    else {
                      bVar17 = pRVar5 == pRVar3;
                      if ((bool)bVar17) {
                        uVar16 = i;
                      }
                    }
                    if (bVar17 == 0) goto LAB_00904490;
                    uVar8 = i;
                    if (bVar17 != 3) goto LAB_009044ac;
                  }
                  else {
LAB_00904490:
                    uVar8 = (this_02->entries).ptr[(int)i].next;
                    previous = i;
                  }
                  i = uVar8;
                } while (-1 < (int)i);
                bVar17 = 0;
LAB_009044ac:
                bVar18 = (bVar17 & 1) == 0;
                uVar14 = uVar16;
              }
              if (!bVar18) goto LAB_009044c0;
            }
            uVar14 = 0xffffffff;
          }
LAB_009044c0:
          if (((int)uVar14 < 0) || ((this_02->entries).ptr[uVar14].value == false)) {
            pSVar2 = (this->m_ttdRootTagToObjectMap).entries;
            uVar14 = pSVar2[(int)uVar9].
                     super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                     super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                     .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next;
            if ((int)uVar12 < 0) {
              this_00->buckets[uVar11] = uVar14;
            }
            else {
              pSVar2[uVar12].
              super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
              super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
              .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next = uVar14;
            }
            pSVar2[(int)uVar9].
            super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
            super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value =
                 (RecyclableObject *)0x0;
            pSVar2[(int)uVar9].
            super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
            super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.key = 0;
            JsUtil::
            BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::SetNextFreeEntryIndex
                      (this_00,(this->m_ttdRootTagToObjectMap).entries + (int)uVar9,
                       -(uint)((this->m_ttdRootTagToObjectMap).freeCount == 0) |
                       (this->m_ttdRootTagToObjectMap).freeList);
            (this->m_ttdRootTagToObjectMap).freeList = uVar9;
            pTVar1 = &(this->m_ttdRootTagToObjectMap).freeCount;
            *pTVar1 = *pTVar1 + 1;
            pDVar7 = (this->m_ttdRootTagToObjectMap).stats;
            uVar9 = uVar14;
            if (pDVar7 != (DictionaryStats *)0x0) {
              DictionaryStats::Remove(pDVar7,this_00->buckets[uVar11] == -1);
            }
          }
          else {
            uVar12 = uVar9;
            uVar9 = (this->m_ttdRootTagToObjectMap).entries[(int)uVar9].
                    super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                    super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next;
          }
        } while (uVar9 != 0xffffffff);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->m_ttdRootTagToObjectMap).bucketCount);
  }
  if ((this->m_ttdMayBeLongLivedRoot).bucketCount != 0) {
    this_01 = &this->m_ttdMayBeLongLivedRoot;
    uVar11 = 0;
    do {
      if (this_01->buckets[uVar11] != 0xffffffff) {
        uVar15 = 0xffffffff;
        uVar9 = this_01->buckets[uVar11];
        do {
          uVar13 = (ulong)uVar9;
          bVar18 = JsUtil::
                   BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::ContainsKey(this_00,&(this->m_ttdMayBeLongLivedRoot).entries[(int)uVar9].
                                          super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                          .super_KeyValueEntry<unsigned_long,_bool>.
                                          super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                                          .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key);
          pSVar6 = (this->m_ttdMayBeLongLivedRoot).entries;
          uVar12 = pSVar6[(int)uVar9].
                   super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_long,_bool>.
                   super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                   .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
          if (!bVar18) {
            piVar10 = &pSVar6[uVar15].
                       super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<unsigned_long,_bool>.
                       super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                       .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
            if ((int)uVar15 < 0) {
              piVar10 = (this->m_ttdMayBeLongLivedRoot).buckets + uVar11;
            }
            *piVar10 = uVar12;
            pSVar6[(int)uVar9].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.value = false;
            pSVar6[(int)uVar9].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key = 0;
            JsUtil::
            BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::SetNextFreeEntryIndex
                      (this_01,pSVar6 + (int)uVar9,
                       -(uint)((this->m_ttdMayBeLongLivedRoot).freeCount == 0) |
                       (this->m_ttdMayBeLongLivedRoot).freeList);
            (this->m_ttdMayBeLongLivedRoot).freeList = uVar9;
            pTVar1 = &(this->m_ttdMayBeLongLivedRoot).freeCount;
            *pTVar1 = *pTVar1 + 1;
            pDVar7 = (this->m_ttdMayBeLongLivedRoot).stats;
            uVar13 = uVar15;
            if (pDVar7 != (DictionaryStats *)0x0) {
              DictionaryStats::Remove(pDVar7,this_01->buckets[uVar11] == -1);
            }
          }
          uVar15 = uVar13;
          uVar9 = uVar12;
        } while (uVar12 != 0xffffffff);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->m_ttdMayBeLongLivedRoot).bucketCount);
  }
  return;
}

Assistant:

void ThreadContextTTD::SyncRootsBeforeSnapshot_Record()
    {
        this->CleanRecordWeakRootMap();

        this->m_ttdRootTagToObjectMap.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, Js::RecyclableObject*>& entry) -> bool
        {
            return !this->m_ttdRecordRootWeakMap->Lookup(entry.Value(), false);
        });

        this->m_ttdMayBeLongLivedRoot.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, bool>& entry) -> bool
        {
            return !this->m_ttdRootTagToObjectMap.ContainsKey(entry.Key());
        });
    }